

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

void __thiscall
spdlog::details::registry::set_tp(registry *this,shared_ptr<spdlog::details::thread_pool> *tp)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->tp_mutex_);
  if (iVar3 == 0) {
    peVar1 = (tp->super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var2 = (tp->super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (tp->super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (tp->super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->tp_).
              super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->tp_).super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar1;
    (this->tp_).super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->tp_mutex_);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

SPDLOG_INLINE void registry::set_tp(std::shared_ptr<thread_pool> tp)
{
    std::lock_guard<std::recursive_mutex> lock(tp_mutex_);
    tp_ = std::move(tp);
}